

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chomp.c
# Opt level: O0

char * chomp(char *str)

{
  size_t sVar1;
  bool bVar2;
  int local_14;
  int len;
  char *str_local;
  
  if (str != (char *)0x0) {
    sVar1 = strlen(str);
    local_14 = (int)sVar1;
    while( true ) {
      bVar2 = false;
      if ((0 < local_14) && (bVar2 = true, str[local_14 + -1] != '\r')) {
        bVar2 = str[local_14 + -1] == '\n';
      }
      if (!bVar2) break;
      local_14 = local_14 + -1;
    }
    str[local_14] = '\0';
  }
  return str;
}

Assistant:

char *chomp(char *str)
{
    if (str) {
        int len = strlen(str);
        while (len > 0 && (str[len-1] == '\r' || str[len-1] == '\n'))
            len--;
        str[len] = '\0';
    }
    return str;
}